

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool mjs::is_directive(expression *e)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = (*(e->super_syntax_node)._vptr_syntax_node[3])();
  if (iVar1 == 2) {
    bVar2 = *(int *)&e[1].super_syntax_node._vptr_syntax_node == 4;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_directive(const expression& e) {
    if (e.type() != expression_type::literal) {
        return false;
    }
    const auto& le = static_cast<const literal_expression&>(e);
    if (le.t().type() != token_type::string_literal) {
        return false;
    }
    return true;
}